

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O3

baseHolder * __thiscall cs_impl::any::holder<cs::callable>::duplicate(holder<cs::callable> *this)

{
  baseHolder *pbVar1;
  
  if ((DAT_00259ed8 == 0) || (cs::global_thread_counter != 0)) {
    pbVar1 = (baseHolder *)operator_new(0x30);
  }
  else {
    pbVar1 = *(baseHolder **)(&holder<bool>::allocator + DAT_00259ed8 * 8);
    DAT_00259ed8 = DAT_00259ed8 + -1;
  }
  pbVar1->_vptr_baseHolder = (_func_int **)&PTR__holder_00250600;
  std::function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>::function
            ((function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)> *)
             (pbVar1 + 1),&(this->mDat).mFunc);
  *(types *)&pbVar1[5]._vptr_baseHolder = (this->mDat).mType;
  return pbVar1;
}

Assistant:

baseHolder *duplicate() override
			{
				return allocator.alloc(mDat);
			}